

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O2

void Wlc_WriteTables(FILE *pFile,Wlc_Ntk_t *p)

{
  uint uVar1;
  word *pTable;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *__s;
  Wlc_Obj_t *pWVar4;
  Wlc_Obj_t *pWVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  if (p->vTables != (Vec_Ptr_t *)0x0) {
    uVar1 = p->vTables->nSize;
    if ((long)(int)uVar1 != 0) {
      p_00 = (Vec_Int_t *)malloc(0x10);
      uVar2 = 0x10;
      if (0x10 < uVar1) {
        uVar2 = uVar1;
      }
      p_00->nCap = uVar2;
      __s = (int *)malloc((long)(int)uVar2 << 2);
      p_00->pArray = __s;
      p_00->nSize = uVar1;
      if (__s != (int *)0x0) {
        memset(__s,0,(long)(int)uVar1 << 2);
      }
      iVar7 = 1;
      do {
        if (p->iObj <= iVar7) {
          lVar8 = 0;
          while( true ) {
            if (p->vTables->nSize <= lVar8) {
              free(__s);
              free(p_00);
              return;
            }
            pTable = (word *)p->vTables->pArray[lVar8];
            iVar7 = Vec_IntEntry(p_00,(int)lVar8);
            pWVar4 = Wlc_NtkObj(p,iVar7);
            if ((undefined1  [24])((undefined1  [24])*pWVar4 & (undefined1  [24])0x3f) !=
                (undefined1  [24])0x35) break;
            pWVar5 = Wlc_ObjFanin0(p,pWVar4);
            iVar6 = pWVar5->End - pWVar5->Beg;
            iVar7 = -iVar6;
            if (0 < iVar6) {
              iVar7 = iVar6;
            }
            iVar3 = pWVar4->End - pWVar4->Beg;
            iVar6 = -iVar3;
            if (0 < iVar3) {
              iVar6 = iVar3;
            }
            Wlc_WriteTableOne(pFile,iVar7 + 1,iVar6 + 1,pTable,(int)lVar8);
            lVar8 = lVar8 + 1;
          }
          __assert_fail("pObj->Type == WLC_OBJ_TABLE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcWriteVer.c"
                        ,0x51,"void Wlc_WriteTables(FILE *, Wlc_Ntk_t *)");
        }
        pWVar4 = Wlc_NtkObj(p,iVar7);
        if ((undefined1  [24])((undefined1  [24])*pWVar4 & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x35) {
          uVar2 = Wlc_ObjTableId(pWVar4);
          if (((int)uVar2 < 0) || ((int)uVar1 <= (int)uVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          __s[uVar2] = iVar7;
        }
        iVar7 = iVar7 + 1;
      } while( true );
    }
  }
  return;
}

Assistant:

void Wlc_WriteTables( FILE * pFile, Wlc_Ntk_t * p )
{
    Vec_Int_t * vNodes;
    Wlc_Obj_t * pObj, * pFanin;
    word * pTable;
    int i;
    if ( p->vTables == NULL || Vec_PtrSize(p->vTables) == 0 )
        return;
    // map tables into their nodes
    vNodes = Vec_IntStart( Vec_PtrSize(p->vTables) );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( pObj->Type == WLC_OBJ_TABLE )
            Vec_IntWriteEntry( vNodes, Wlc_ObjTableId(pObj), i );
    // write tables
    Vec_PtrForEachEntry( word *, p->vTables, pTable, i )
    {
        pObj = Wlc_NtkObj( p, Vec_IntEntry(vNodes, i) );
        assert( pObj->Type == WLC_OBJ_TABLE );
        pFanin = Wlc_ObjFanin0( p, pObj );
        Wlc_WriteTableOne( pFile, Wlc_ObjRange(pFanin), Wlc_ObjRange(pObj), pTable, i );
    }
    Vec_IntFree( vNodes );
}